

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_base.h
# Opt level: O0

string * __thiscall
test_uintwide_t_n_base::
hexlexical_cast<math::wide_integer::uintwide_t<48u,unsigned_short,void,false>>
          (string *__return_storage_ptr__,test_uintwide_t_n_base *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *u)

{
  basic_ostream<char,_std::char_traits<char>_> *out;
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [376];
  test_uintwide_t_n_base *local_18;
  uintwide_t<24U,_unsigned_char,_void,_false> *u_local;
  
  local_18 = this;
  u_local = (uintwide_t<24U,_unsigned_char,_void,_false> *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  out = (basic_ostream<char,_std::char_traits<char>_> *)std::ostream::operator<<(local_190,std::hex)
  ;
  math::wide_integer::operator<<(out,(uintwide_t<24U,_unsigned_char,_void,_false> *)local_18);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static auto hexlexical_cast(const UnsignedIntegralType& u) -> std::string
    {
      std::stringstream ss;

      ss << std::hex << u;

      return ss.str();
    }